

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

bool llvm::consumeSignedInteger(StringRef *Str,uint Radix,longlong *Result)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  unsigned_long_long ULLVal;
  StringRef Str2;
  ulong local_38;
  StringRef local_30;
  
  if ((Str->Length == 0) || (cVar1 = StringRef::front(Str), cVar1 != '-')) {
    bVar2 = consumeUnsignedInteger(Str,Radix,&local_38);
    if (-1 < (long)local_38 && !bVar2) {
      *Result = local_38;
    }
    return -1 >= (long)local_38 || bVar2;
  }
  if (Str->Length == 0) {
    __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                  ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
  }
  local_30.Data = Str->Data + 1;
  local_30.Length = Str->Length - 1;
  bVar2 = consumeUnsignedInteger(&local_30,Radix,&local_38);
  bVar3 = 0x8000000000000000 < local_38 || bVar2;
  if (0x8000000000000000 < local_38 || bVar2) {
    return bVar3;
  }
  Str->Data = local_30.Data;
  Str->Length = local_30.Length;
  *Result = -local_38;
  return bVar3;
}

Assistant:

bool llvm::consumeSignedInteger(StringRef &Str, unsigned Radix,
                                long long &Result) {
  unsigned long long ULLVal;

  // Handle positive strings first.
  if (Str.empty() || Str.front() != '-') {
    if (consumeUnsignedInteger(Str, Radix, ULLVal) ||
        // Check for value so large it overflows a signed value.
        (long long)ULLVal < 0)
      return true;
    Result = ULLVal;
    return false;
  }

  // Get the positive part of the value.
  StringRef Str2 = Str.drop_front(1);
  if (consumeUnsignedInteger(Str2, Radix, ULLVal) ||
      // Reject values so large they'd overflow as negative signed, but allow
      // "-0".  This negates the unsigned so that the negative isn't undefined
      // on signed overflow.
      (long long)-ULLVal > 0)
    return true;

  Str = Str2;
  Result = -ULLVal;
  return false;
}